

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

size_t prt_tmd(wchar_t row,wchar_t col)

{
  size_t sVar1;
  char *str;
  char *meter;
  timed_grade_conflict *grade;
  size_t len;
  size_t i;
  wchar_t col_local;
  wchar_t row_local;
  
  grade = (timed_grade_conflict *)0x0;
  for (len = 0; len < 0x35; len = len + 1) {
    if (player->timed[len] != 0) {
      for (meter = (char *)timed_effects[len].grade; *(int *)(meter + 8) < (int)player->timed[len];
          meter = *(char **)(meter + 0x28)) {
      }
      if (*(long *)(meter + 0x10) != 0) {
        c_put_str(meter[4],*(char **)(meter + 0x10),row,col + (int)grade);
        sVar1 = strlen(*(char **)(meter + 0x10));
        grade = (timed_grade_conflict *)((long)&grade->grade + sVar1 + 1);
        if (len == 10) {
          str = format("%d %%",(long)(int)player->timed[10] / 100 & 0xffffffff,
                       (long)(int)player->timed[10] % 100 & 0xffffffff);
          c_put_str(meter[4],str,row,col + (int)grade);
          sVar1 = strlen(str);
          grade = (timed_grade_conflict *)((long)&grade->grade + sVar1 + 1);
        }
      }
    }
  }
  return (size_t)grade;
}

Assistant:

static size_t prt_tmd(int row, int col)
{
	size_t i, len = 0;

	for (i = 0; i < TMD_MAX; i++) {
		if (player->timed[i]) {
			struct timed_grade *grade = timed_effects[i].grade;
			while (player->timed[i] > grade->max) {
				grade = grade->next;
			}
			if (!grade->name) continue;
			c_put_str(grade->color, grade->name, row, col + len);
			len += strlen(grade->name) + 1;

			/* Food meter */
			if (i == TMD_FOOD) {
				char *meter = format("%d %%", player->timed[i] / 100);
				c_put_str(grade->color, meter, row, col + len);
				len += strlen(meter) + 1;
			}
		}
	}

	return len;
}